

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmTextureCalc::AlignTexHeightWidth
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,uint32_t *pHeight,uint32_t *pWidth)

{
  uint local_58;
  uint32_t local_54;
  uint32_t local_48;
  uint local_44;
  uint32_t CompressDepth;
  uint32_t CompressWidth;
  uint32_t CompressHeight;
  uint32_t uStack_34;
  uint8_t Compress;
  uint32_t UnitAlignWidth;
  uint32_t UnitAlignHeight;
  uint32_t MipHeight;
  uint32_t MipWidth;
  uint32_t *pWidth_local;
  uint32_t *pHeight_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  CompressWidth._3_1_ = 0;
  if ((((pTexInfo != (GMM_TEXTURE_INFO *)0x0) && (pWidth != (uint32_t *)0x0)) &&
      (pHeight != (uint32_t *)0x0)) && (this->pGmmLibContext != (Context *)0x0)) {
    UnitAlignHeight = *pWidth;
    UnitAlignWidth = *pHeight;
    CompressHeight = (pTexInfo->Alignment).HAlign;
    uStack_34 = (pTexInfo->Alignment).VAlign;
    _MipHeight = pWidth;
    pWidth_local = pHeight;
    pHeight_local = &pTexInfo->Type;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    CompressWidth._3_1_ = GmmIsCompressed(this->pGmmLibContext,pTexInfo->Format);
    if (CompressHeight < UnitAlignHeight) {
      local_54 = UnitAlignHeight;
    }
    else {
      local_54 = CompressHeight;
    }
    if (uStack_34 < UnitAlignWidth) {
      local_58 = UnitAlignWidth;
    }
    else {
      local_58 = uStack_34;
    }
    UnitAlignHeight =
         (local_54 + (CompressHeight - 1)) - (local_54 + (CompressHeight - 1) & CompressHeight - 1);
    UnitAlignWidth = (local_58 + (uStack_34 - 1)) - (local_58 + (uStack_34 - 1) & uStack_34 - 1);
    if (CompressWidth._3_1_ == '\0') {
      if (((*(ulong *)(pHeight_local + 3) >> 0x1d & 1) != 0) &&
         ((*(ulong *)(pHeight_local + 5) >> 0x22 & 1) != 0)) {
        UnitAlignHeight = UnitAlignHeight * 2;
        UnitAlignWidth = UnitAlignWidth >> 1;
      }
    }
    else {
      GetCompressionBlockDimensions(this,pHeight_local[1],&local_44,&CompressDepth,&local_48);
      UnitAlignHeight = UnitAlignHeight / local_44;
      UnitAlignWidth = UnitAlignWidth / CompressDepth;
    }
    *pWidth_local = UnitAlignWidth;
    *_MipHeight = UnitAlignHeight;
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::AlignTexHeightWidth(GMM_TEXTURE_INFO *pTexInfo,
                                                 uint32_t *        pHeight,
                                                 uint32_t *        pWidth)
{
    uint32_t MipWidth        = 0;
    uint32_t MipHeight       = 0;
    uint32_t UnitAlignHeight = 0;
    uint32_t UnitAlignWidth  = 0;

    uint8_t Compress = 0;

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);
    __GMM_ASSERTPTR(pWidth, VOIDRETURN);
    __GMM_ASSERTPTR(pHeight, VOIDRETURN);
    __GMM_ASSERTPTR(pGmmLibContext, VOIDRETURN);

    MipWidth  = *pWidth;
    MipHeight = *pHeight;

    UnitAlignWidth  = pTexInfo->Alignment.HAlign;
    UnitAlignHeight = pTexInfo->Alignment.VAlign;
    Compress        = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);

    MipWidth  = GFX_MAX(MipWidth, UnitAlignWidth);
    MipHeight = GFX_MAX(MipHeight, UnitAlignHeight);

    MipWidth  = GFX_ALIGN(MipWidth, UnitAlignWidth);
    MipHeight = GFX_ALIGN(MipHeight, UnitAlignHeight);

    if(Compress)
    {
        uint32_t CompressHeight, CompressWidth, CompressDepth;
        GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);
        MipWidth /= CompressWidth;
        MipHeight /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        MipWidth *= 2;
        MipHeight /= 2;
    }

    *pHeight = MipHeight;
    *pWidth  = MipWidth;
}